

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  long *plVar2;
  long lVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m128i *palVar11;
  __m128i *palVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar17;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *b_06;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  __m128i *palVar23;
  long lVar24;
  long lVar25;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  long lVar26;
  ulong uVar27;
  int iVar28;
  ulong size;
  long lVar29;
  ulong uVar30;
  long lVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  longlong lVar40;
  long lVar41;
  __m128i *palVar42;
  __m128i *ptr;
  long lVar43;
  __m128i *palVar44;
  __m128i *ptr_00;
  bool bVar45;
  ulong uVar46;
  long lVar47;
  undefined1 extraout_XMM0 [16];
  longlong lVar54;
  long lVar55;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  __m128i_64_t B_1;
  longlong lVar57;
  undefined1 auVar56 [16];
  __m128i_64_t B_2;
  undefined1 auVar58 [16];
  long lVar59;
  undefined1 auVar60 [16];
  long lVar62;
  undefined1 auVar61 [16];
  __m128i_64_t B_4;
  longlong lVar64;
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  __m128i_64_t B;
  undefined1 auVar73 [16];
  long lVar76;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  __m128i_64_t B_3;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  __m128i_64_t B_5;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  long lVar82;
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  long lVar84;
  long lVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  int32_t column_len;
  __m128i_64_t B_6;
  __m128i *local_1f8;
  __m128i *local_1f0;
  __m128i *local_1e8;
  __m128i *local_1e0;
  __m128i *local_1d8;
  __m128i *local_1d0;
  __m128i *local_1c8;
  __m128i *local_1c0;
  __m128i *local_1b8;
  __m128i *local_1b0;
  __m128i *local_1a0;
  __m128i *local_178;
  int local_148;
  longlong local_130;
  undefined1 local_98 [16];
  ulong uStack_80;
  ulong uStack_70;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_stats_table_striped_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sw_stats_table_striped_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_table_striped_profile_sse41_128_64_cold_6();
      }
      else {
        uVar32 = profile->s1Len;
        uVar16 = (ulong)uVar32;
        if ((int)uVar32 < 1) {
          parasail_sw_stats_table_striped_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_table_striped_profile_sse41_128_64_cold_4();
        }
        else {
          uVar30 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_stats_table_striped_profile_sse41_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_sw_stats_table_striped_profile_sse41_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_stats_table_striped_profile_sse41_128_64_cold_1();
          }
          else {
            uVar1 = uVar16 + 1;
            pvVar6 = (profile->profile64).matches;
            pvVar7 = (profile->profile64).similar;
            iVar15 = ppVar5->max;
            result = parasail_result_new_table3((uint)uVar1 & 0x7ffffffe,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar1 >> 1;
              result->flag = result->flag | 0x2830804;
              b = parasail_memalign___m128i(0x10,size);
              palVar17 = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              local_1b0 = parasail_memalign___m128i(0x10,size);
              b_01 = parasail_memalign___m128i(0x10,size);
              local_1d8 = parasail_memalign___m128i(0x10,size);
              b_02 = parasail_memalign___m128i(0x10,size);
              local_1e0 = parasail_memalign___m128i(0x10,size);
              b_03 = parasail_memalign___m128i(0x10,size);
              b_04 = parasail_memalign___m128i(0x10,size);
              b_05 = parasail_memalign___m128i(0x10,size);
              b_06 = parasail_memalign___m128i(0x10,size);
              local_1b8 = parasail_memalign___m128i(0x10,size);
              local_1c0 = parasail_memalign___m128i(0x10,size);
              local_1c8 = parasail_memalign___m128i(0x10,size);
              local_1d0 = parasail_memalign___m128i(0x10,size);
              if (b == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (palVar17 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (b_00 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (local_1b0 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (b_01 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (local_1d8 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (b_02 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (local_1e0 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (b_03 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (b_04 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (b_05 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (b_06 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (local_1b8 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (local_1c0 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (local_1c8 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (local_1d0 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              uVar46 = (ulong)(uint)gap;
              c[1] = 0x7fffffffffffffff;
              c[0] = size;
              palVar23 = b_02;
              parasail_memset___m128i(b,c,(size_t)b_02);
              c_00[1] = extraout_RDX;
              c_00[0] = size;
              parasail_memset___m128i(b_00,c_00,(size_t)palVar23);
              c_01[1] = extraout_RDX_00;
              c_01[0] = size;
              parasail_memset___m128i(b_01,c_01,(size_t)palVar23);
              c_02[1] = extraout_RDX_01;
              c_02[0] = size;
              parasail_memset___m128i(b_02,c_02,(size_t)palVar23);
              c_03[1] = extraout_RDX_02;
              c_03[0] = size;
              parasail_memset___m128i(b_03,c_03,(size_t)palVar23);
              c_04[1] = extraout_RDX_03;
              c_04[0] = size;
              parasail_memset___m128i(b_04,c_04,(size_t)palVar23);
              c_05[1] = extraout_RDX_04;
              c_05[0] = size;
              parasail_memset___m128i(b_05,c_05,(size_t)palVar23);
              pmovsxbq(extraout_XMM0,0x101);
              c_06[1] = extraout_RDX_05;
              c_06[0] = size;
              parasail_memset___m128i(b_06,c_06,(size_t)palVar23);
              uVar8 = (uint)size;
              uVar13 = uVar8 - 1;
              lVar29 = size * uVar30 * 4;
              lVar3 = uVar30 * 4;
              lVar21 = 0;
              uVar35 = 0;
              iVar28 = 0;
              local_130 = 0;
              lVar43 = -0x4000000000000000;
              lVar25 = 0;
              lVar20 = 0;
              local_98 = (undefined1  [16])0x0;
              lVar19 = 0;
              lVar24 = 0;
              lVar41 = lVar29;
              do {
                local_1e8 = b_02;
                local_1f0 = b_01;
                palVar44 = b_00;
                palVar42 = b;
                lVar33 = (long)(int)(ppVar5->mapper[(byte)s2[uVar35]] * uVar8) * 0x10;
                local_148 = (int)uVar35;
                b = palVar17;
                b_00 = local_1b0;
                b_02 = local_1e0;
                palVar23 = local_1c8;
                b_01 = local_1d8;
                if (iVar28 == local_148 + -2) {
                  b = local_1b8;
                  b_00 = local_1c0;
                  b_02 = local_1d0;
                  local_1c0 = local_1b0;
                  local_1d0 = local_1e0;
                  palVar23 = local_1d8;
                  local_1b8 = palVar17;
                  b_01 = local_1c8;
                }
                local_1c8 = palVar23;
                local_1e0 = local_1e8;
                lVar57 = local_1e8[uVar13][0];
                lVar39 = 0;
                local_1d8 = local_1f0;
                lVar40 = local_1f0[uVar13][0];
                lVar31 = 0;
                lVar64 = palVar44[uVar13][0];
                lVar26 = 0;
                lVar54 = palVar42[uVar13][0];
                lVar47 = 0;
                lVar36 = 0;
                auVar83 = ZEXT816(0);
                auVar70 = ZEXT816(0);
                auVar73 = (undefined1  [16])0x0;
                lVar34 = lVar41;
                lVar38 = lVar21;
                auVar65 = _DAT_008d0e90;
                lVar37 = lVar19;
                lVar82 = lVar24;
                do {
                  plVar2 = (long *)((long)*b_03 + lVar36);
                  lVar59 = *plVar2;
                  lVar62 = plVar2[1];
                  lVar24 = *(long *)((long)*b_03 + lVar36);
                  lVar19 = *(long *)((long)*b_03 + lVar36 + 8);
                  auVar58 = *(undefined1 (*) [16])((long)*b_04 + lVar36);
                  auVar72 = *(undefined1 (*) [16])((long)*b_05 + lVar36);
                  plVar2 = (long *)((long)pvVar4 + lVar36 + lVar33);
                  lVar47 = lVar47 + *plVar2;
                  lVar55 = lVar54 + plVar2[1];
                  if (lVar47 < 1) {
                    lVar47 = 0;
                  }
                  auVar78 = *(undefined1 (*) [16])((long)*b_06 + lVar36);
                  if (lVar55 < 1) {
                    lVar55 = 0;
                  }
                  lVar84 = lVar47;
                  if (lVar47 <= lVar24) {
                    lVar84 = lVar24;
                  }
                  lVar85 = lVar55;
                  if (lVar55 <= lVar19) {
                    lVar85 = lVar19;
                  }
                  lVar18 = auVar73._0_8_;
                  if (lVar84 <= lVar18) {
                    lVar84 = lVar18;
                  }
                  lVar76 = auVar73._8_8_;
                  if (lVar85 <= lVar76) {
                    lVar85 = lVar76;
                  }
                  plVar2 = (long *)((long)*b + lVar36);
                  *plVar2 = lVar84;
                  plVar2[1] = lVar85;
                  auVar80._0_8_ = -(ulong)(lVar84 == lVar18);
                  auVar80._8_8_ = -(ulong)(lVar85 == lVar76);
                  auVar73 = blendvpd(auVar58,auVar70,auVar80);
                  plVar2 = (long *)((long)pvVar6 + lVar36 + lVar33);
                  auVar69._0_8_ = lVar26 + *plVar2;
                  auVar69._8_8_ = lVar64 + plVar2[1];
                  auVar74._0_8_ = -(ulong)(lVar47 == lVar84);
                  auVar74._8_8_ = -(ulong)(lVar55 == lVar85);
                  auVar73 = blendvpd(auVar73,auVar69,auVar74);
                  auVar86._0_8_ = -(ulong)(lVar84 == 0);
                  auVar86._8_8_ = -(ulong)(lVar85 == 0);
                  auVar73 = ~auVar86 & auVar73;
                  *(undefined1 (*) [16])((long)*b_00 + lVar36) = auVar73;
                  auVar68 = blendvpd(auVar72,auVar83,auVar80);
                  plVar2 = (long *)((long)pvVar7 + lVar36 + lVar33);
                  auVar79._0_8_ = lVar31 + *plVar2;
                  auVar79._8_8_ = lVar40 + plVar2[1];
                  auVar69 = blendvpd(auVar68,auVar79,auVar74);
                  auVar80 = blendvpd(auVar78,auVar65,auVar80);
                  auVar68._8_4_ = 0xffffffff;
                  auVar68._0_8_ = 0xffffffffffffffff;
                  auVar68._12_4_ = 0xffffffff;
                  auVar60._0_8_ = lVar39 + 1;
                  auVar60._8_8_ = lVar57 - auVar68._8_8_;
                  auVar68 = blendvpd(auVar80,auVar60,auVar74);
                  auVar69 = ~auVar86 & auVar69;
                  auVar68 = ~auVar86 & auVar68;
                  lVar24 = auVar73._0_8_;
                  if (auVar73._0_8_ < lVar25) {
                    lVar24 = lVar25;
                  }
                  *(undefined1 (*) [16])((long)*b_01 + lVar36) = auVar69;
                  lVar19 = auVar73._8_8_;
                  if (auVar73._8_8_ < lVar20) {
                    lVar19 = lVar20;
                  }
                  if (lVar24 <= auVar69._0_8_) {
                    lVar24 = auVar69._0_8_;
                  }
                  *(undefined1 (*) [16])((long)*b_02 + lVar36) = auVar68;
                  if (lVar19 <= auVar69._8_8_) {
                    lVar19 = auVar69._8_8_;
                  }
                  lVar47 = auVar68._0_8_;
                  lVar25 = lVar24;
                  if (lVar24 <= lVar47) {
                    lVar25 = lVar47;
                  }
                  lVar39 = auVar68._8_8_;
                  lVar20 = *(long *)((long)((result->field_4).trace)->trace_del_table + 8);
                  *(int *)(lVar20 + lVar38) = auVar73._0_4_;
                  *(int *)(lVar20 + lVar34) = auVar73._8_4_;
                  lVar20 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x10);
                  *(int *)(lVar20 + lVar38) = auVar69._0_4_;
                  *(int *)(lVar20 + lVar34) = auVar69._8_4_;
                  lVar20 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x18);
                  *(int *)(lVar20 + lVar38) = auVar68._0_4_;
                  *(int *)(lVar20 + lVar34) = auVar68._8_4_;
                  lVar20 = lVar19;
                  if (lVar19 <= lVar39) {
                    lVar20 = lVar39;
                  }
                  lVar24 = *((result->field_4).trace)->trace_del_table;
                  *(int *)(lVar24 + lVar38) = (int)lVar84;
                  *(int *)(lVar24 + lVar34) = (int)lVar85;
                  lVar19 = lVar84;
                  if (lVar84 <= lVar37) {
                    lVar19 = lVar37;
                  }
                  lVar24 = lVar85;
                  if (lVar85 <= lVar82) {
                    lVar24 = lVar82;
                  }
                  uStack_70 = (ulong)(uint)open;
                  lVar84 = lVar84 - (ulong)(uint)open;
                  lVar85 = lVar85 - uStack_70;
                  uStack_80 = (ulong)(uint)gap;
                  lVar59 = lVar59 - uVar46;
                  lVar62 = lVar62 - uStack_80;
                  lVar26 = lVar59;
                  if (lVar59 < lVar84) {
                    lVar26 = lVar84;
                  }
                  lVar31 = lVar62;
                  if (lVar62 < lVar85) {
                    lVar31 = lVar85;
                  }
                  lVar18 = lVar18 - uVar46;
                  lVar76 = lVar76 - uStack_80;
                  lVar37 = lVar18;
                  if (lVar18 < lVar84) {
                    lVar37 = lVar84;
                  }
                  lVar82 = lVar76;
                  if (lVar76 < lVar85) {
                    lVar82 = lVar85;
                  }
                  auVar48._8_8_ = -(ulong)(lVar62 < lVar85);
                  auVar48._0_8_ = -(ulong)(lVar59 < lVar84);
                  auVar68 = pblendvb(auVar58,auVar73,auVar48);
                  auVar74 = pblendvb(auVar72,auVar69,auVar48);
                  auVar77._8_4_ = 0xffffffff;
                  auVar77._0_8_ = 0xffffffffffffffff;
                  auVar77._12_4_ = 0xffffffff;
                  auVar71._0_8_ = auVar78._0_8_ + 1;
                  auVar71._8_8_ = auVar78._8_8_ - auVar77._8_8_;
                  auVar87._0_8_ = lVar47 + 1;
                  auVar87._8_8_ = lVar39 - auVar77._8_8_;
                  auVar78._8_4_ = 0xffffffff;
                  auVar78._0_8_ = 0xffffffffffffffff;
                  auVar78._12_4_ = 0xffffffff;
                  auVar72 = pblendvb(auVar71,auVar87,auVar48);
                  auVar58._8_8_ = -(ulong)(lVar76 < lVar85);
                  auVar58._0_8_ = -(ulong)(lVar18 < lVar84);
                  auVar70 = pblendvb(auVar70,auVar73,auVar58);
                  plVar2 = (long *)((long)*b_03 + lVar36);
                  *plVar2 = lVar26;
                  plVar2[1] = lVar31;
                  *(undefined1 (*) [16])((long)*b_04 + lVar36) = auVar68;
                  *(undefined1 (*) [16])((long)*b_05 + lVar36) = auVar74;
                  *(undefined1 (*) [16])((long)*b_06 + lVar36) = auVar72;
                  auVar73._8_8_ = lVar82;
                  auVar73._0_8_ = lVar37;
                  auVar83 = pblendvb(auVar83,auVar69,auVar58);
                  auVar72._0_8_ = auVar65._0_8_ + 1;
                  auVar72._8_8_ = auVar65._8_8_ - auVar78._8_8_;
                  auVar65 = pblendvb(auVar72,auVar87,auVar58);
                  plVar2 = (long *)((long)*palVar42 + lVar36);
                  lVar47 = *plVar2;
                  lVar54 = plVar2[1];
                  plVar2 = (long *)((long)*palVar44 + lVar36);
                  lVar26 = *plVar2;
                  lVar64 = plVar2[1];
                  plVar2 = (long *)((long)*local_1f0 + lVar36);
                  lVar31 = *plVar2;
                  lVar40 = plVar2[1];
                  plVar2 = (long *)((long)*local_1e8 + lVar36);
                  lVar39 = *plVar2;
                  lVar57 = plVar2[1];
                  lVar36 = lVar36 + 0x10;
                  lVar34 = lVar34 + lVar3;
                  lVar38 = lVar38 + lVar3;
                  lVar37 = lVar19;
                  lVar82 = lVar24;
                } while (size << 4 != lVar36);
                iVar22 = 0;
                do {
                  auVar66._0_8_ = auVar65._0_8_;
                  auVar66._8_4_ = auVar65._0_4_;
                  auVar66._12_4_ = auVar65._4_4_;
                  auVar65._8_8_ = auVar66._8_8_;
                  auVar65._0_8_ = 1;
                  auVar9._8_8_ = 0;
                  auVar9._0_8_ = auVar83._0_8_;
                  auVar83 = auVar9 << 0x40;
                  auVar10._8_8_ = 0;
                  auVar10._0_8_ = auVar70._0_8_;
                  auVar70 = auVar10 << 0x40;
                  auVar75._0_8_ = auVar73._0_8_;
                  auVar75._8_4_ = auVar73._0_4_;
                  auVar75._12_4_ = auVar73._4_4_;
                  auVar73._8_8_ = auVar75._8_8_;
                  auVar73._0_8_ = (long)-open;
                  lVar57 = palVar42[uVar13][0];
                  lVar47 = 0;
                  lVar34 = 0;
                  lVar39 = lVar21;
                  lVar26 = lVar19;
                  lVar31 = lVar24;
                  do {
                    plVar2 = (long *)((long)pvVar4 + lVar34 + lVar33);
                    lVar47 = lVar47 + *plVar2;
                    lVar57 = lVar57 + plVar2[1];
                    if (lVar47 < 1) {
                      lVar47 = 0;
                    }
                    if (lVar57 < 1) {
                      lVar57 = 0;
                    }
                    lVar37 = auVar73._0_8_;
                    lVar24 = *(long *)((long)*b + lVar34);
                    lVar19 = *(long *)((long)*b + lVar34 + 8);
                    lVar38 = lVar37;
                    if (lVar37 < lVar24) {
                      lVar38 = lVar24;
                    }
                    lVar36 = auVar73._8_8_;
                    lVar82 = lVar36;
                    if (lVar36 < lVar19) {
                      lVar82 = lVar19;
                    }
                    plVar2 = (long *)((long)*b + lVar34);
                    *plVar2 = lVar38;
                    plVar2[1] = lVar82;
                    auVar50._0_8_ = -(ulong)(lVar38 == lVar37);
                    auVar50._8_8_ = -(ulong)(lVar82 == lVar36);
                    auVar49._0_8_ = -(ulong)(lVar38 == lVar47);
                    auVar49._8_8_ = -(ulong)(lVar82 == lVar57);
                    auVar50 = ~auVar49 & auVar50;
                    auVar58 = blendvpd(*(undefined1 (*) [16])((long)*b_00 + lVar34),auVar70,auVar50)
                    ;
                    *(undefined1 (*) [16])((long)*b_00 + lVar34) = auVar58;
                    auVar78 = blendvpd(*(undefined1 (*) [16])((long)*b_01 + lVar34),auVar83,auVar50)
                    ;
                    *(undefined1 (*) [16])((long)*b_01 + lVar34) = auVar78;
                    auVar72 = blendvpd(*(undefined1 (*) [16])((long)*b_02 + lVar34),auVar65,auVar50)
                    ;
                    lVar24 = auVar58._0_8_;
                    if (auVar58._0_8_ < lVar25) {
                      lVar24 = lVar25;
                    }
                    lVar19 = auVar58._8_8_;
                    if (auVar58._8_8_ < lVar20) {
                      lVar19 = lVar20;
                    }
                    if (lVar24 <= auVar78._0_8_) {
                      lVar24 = auVar78._0_8_;
                    }
                    *(undefined1 (*) [16])((long)*b_02 + lVar34) = auVar72;
                    if (lVar19 <= auVar78._8_8_) {
                      lVar19 = auVar78._8_8_;
                    }
                    lVar59 = auVar72._0_8_;
                    lVar25 = lVar24;
                    if (lVar24 <= lVar59) {
                      lVar25 = lVar59;
                    }
                    lVar62 = auVar72._8_8_;
                    lVar20 = lVar19;
                    if (lVar19 <= lVar62) {
                      lVar20 = lVar62;
                    }
                    lVar24 = *(long *)((long)((result->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar24 + lVar39) = auVar58._0_4_;
                    *(int *)(lVar29 + lVar24 + lVar39) = auVar58._8_4_;
                    lVar24 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar24 + lVar39) = auVar78._0_4_;
                    *(int *)(lVar29 + lVar24 + lVar39) = auVar78._8_4_;
                    lVar24 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar24 + lVar39) = auVar72._0_4_;
                    *(int *)(lVar29 + lVar24 + lVar39) = auVar72._8_4_;
                    lVar24 = *((result->field_4).trace)->trace_del_table;
                    *(int *)(lVar24 + lVar39) = (int)lVar38;
                    lVar19 = lVar38;
                    if (lVar38 <= lVar26) {
                      lVar19 = lVar26;
                    }
                    *(int *)(lVar29 + lVar24 + lVar39) = (int)lVar82;
                    lVar24 = lVar82;
                    if (lVar82 <= lVar31) {
                      lVar24 = lVar31;
                    }
                    lVar38 = lVar38 - (ulong)(uint)open;
                    lVar82 = lVar82 - uStack_70;
                    auVar61._0_8_ = lVar37 - uVar46;
                    auVar61._8_8_ = lVar36 - uStack_80;
                    auVar52._8_8_ = -(ulong)(lVar82 < auVar61._8_8_);
                    auVar52._0_8_ = -(ulong)(lVar38 < auVar61._0_8_);
                    auVar81._0_8_ = -(ulong)(lVar38 == auVar61._0_8_);
                    auVar81._8_8_ = -(ulong)(lVar82 == auVar61._8_8_);
                    auVar51._8_8_ = -(ulong)(0 < auVar61._8_8_);
                    auVar51._0_8_ = -(ulong)(0 < auVar61._0_8_);
                    auVar52 = auVar51 & auVar81 | auVar52;
                    if ((((((((((((((((auVar52 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar52 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar52 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar52 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar52 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar52 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar52 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar52 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar52 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar52 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar52 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar52 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar52 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar52[0xf]) {
                      iVar14 = 0x1e;
                    }
                    else {
                      auVar53._8_8_ = -(ulong)(auVar61._8_8_ < lVar82);
                      auVar53._0_8_ = -(ulong)(auVar61._0_8_ < lVar38);
                      auVar70 = pblendvb(auVar70,auVar58,auVar53);
                      auVar83 = pblendvb(auVar83,auVar78,auVar53);
                      auVar56._8_4_ = 0xffffffff;
                      auVar56._0_8_ = 0xffffffffffffffff;
                      auVar56._12_4_ = 0xffffffff;
                      auVar67._0_8_ = auVar65._0_8_ + 1;
                      auVar67._8_8_ = auVar65._8_8_ - auVar56._8_8_;
                      auVar63._0_8_ = lVar59 + 1;
                      auVar63._8_8_ = lVar62 - auVar56._8_8_;
                      auVar65 = pblendvb(auVar67,auVar63,auVar53);
                      plVar2 = (long *)((long)*palVar42 + lVar34);
                      lVar47 = *plVar2;
                      lVar57 = plVar2[1];
                      iVar14 = 0;
                      auVar73 = auVar61;
                    }
                    if ((((((((((((((((auVar52 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar52 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar52 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar52 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar52 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar52 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar52 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar52 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar52 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar52 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar52 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar52 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar52 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar52[0xf]) goto LAB_006cc149;
                    lVar34 = lVar34 + 0x10;
                    lVar39 = lVar39 + lVar3;
                    lVar26 = lVar19;
                    lVar31 = lVar24;
                  } while (size << 4 != lVar34);
                  iVar14 = 0;
LAB_006cc149:
                  if (iVar14 != 0) {
                    if (iVar14 != 0x1e) {
                      bVar45 = false;
                      goto LAB_006cc20b;
                    }
                    break;
                  }
                  bVar45 = iVar22 == 0;
                  iVar22 = iVar22 + 1;
                } while (bVar45);
                uVar27 = -(ulong)((long)local_98._8_8_ < lVar24);
                auVar70._8_8_ = uVar27;
                auVar70._0_8_ = -(ulong)((long)local_98._0_8_ < lVar19);
                bVar45 = true;
                if ((((((((((((((((auVar70 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar70 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar70 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar70 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar70 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar70 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (uVar27 >> 7 & 1) != 0) || (uVar27 >> 0xf & 1) != 0) ||
                        (uVar27 >> 0x17 & 1) != 0) || (uVar27 >> 0x1f & 1) != 0) ||
                      (uVar27 >> 0x27 & 1) != 0) || (uVar27 >> 0x2f & 1) != 0) ||
                    (uVar27 >> 0x37 & 1) != 0) || (long)local_98._8_8_ < lVar24) {
                  lVar43 = lVar24;
                  if (lVar24 < lVar19) {
                    lVar43 = lVar19;
                  }
                  if ((long)(~(long)iVar15 + 0x7fffffffffffffffU) < lVar43) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                    bVar45 = false;
                  }
                  else {
                    local_98._8_4_ = (int)lVar43;
                    local_98._0_8_ = lVar43;
                    local_98._12_4_ = (int)((ulong)lVar43 >> 0x20);
                    iVar28 = local_148;
                  }
                }
LAB_006cc20b:
                local_1b0 = palVar44;
                if (!bVar45) break;
                uVar35 = uVar35 + 1;
                lVar41 = lVar41 + 4;
                lVar21 = lVar21 + 4;
                palVar17 = palVar42;
                local_148 = s2Len;
              } while (uVar35 != uVar30);
              if ((lVar43 == 0x7fffffffffffffff) ||
                 (auVar83._0_8_ = -(ulong)(lVar25 == 0x7fffffffffffffff),
                 auVar83._8_8_ = -(ulong)(lVar20 == 0x7fffffffffffffff),
                 iVar15 = movmskpd(0xffffffff,auVar83), iVar15 != 0)) {
                *(byte *)&result->flag = (byte)result->flag | 0x40;
              }
              iVar15 = parasail_result_is_saturated(result);
              iVar22 = 0;
              local_1f8 = palVar42;
              if (iVar15 == 0) {
                local_1a0 = b_00;
                palVar17 = b_02;
                local_178 = b;
                palVar23 = b_01;
                ptr = local_1b8;
                ptr_00 = local_1c0;
                palVar11 = local_1c8;
                palVar12 = local_1d0;
                if ((iVar28 != local_148 + -1) &&
                   (local_1a0 = local_1c0, palVar17 = local_1d0, local_178 = local_1b8,
                   palVar23 = local_1c8, ptr = b, ptr_00 = b_00, palVar11 = b_01, palVar12 = b_02,
                   iVar28 == local_148 + -2)) {
                  local_1d8 = local_1c8;
                  local_1e0 = local_1d0;
                  local_1f8 = local_1b8;
                  local_1a0 = palVar44;
                  palVar17 = local_1e8;
                  local_178 = palVar42;
                  palVar23 = local_1f0;
                  local_1b0 = local_1c0;
                }
                local_1e8 = palVar12;
                local_1f0 = palVar11;
                if ((uVar1 & 0x7ffffffe) == 0) {
                  iVar22 = 0;
                  iVar14 = 0;
                  iVar15 = 0;
                }
                else {
                  uVar30 = 0;
                  lVar57 = 0;
                  lVar40 = 0;
                  do {
                    if ((*local_178)[uVar30] == lVar43) {
                      uVar32 = 0;
                      if ((uVar30 & 1) != 0) {
                        uVar32 = uVar8;
                      }
                      uVar32 = uVar32 + ((uint)(uVar30 >> 1) & 0x7fffffff);
                      if ((int)uVar32 < (int)uVar16) {
                        local_130 = (*local_1a0)[uVar30];
                        lVar57 = (*palVar23)[uVar30];
                        lVar40 = (*palVar17)[uVar30];
                        uVar16 = (ulong)uVar32;
                      }
                    }
                    iVar14 = (int)lVar40;
                    iVar22 = (int)lVar57;
                    uVar32 = (uint)uVar16;
                    uVar30 = uVar30 + 1;
                  } while ((uVar8 & 0x3fffffff) * 2 != (int)uVar30);
                  iVar15 = (int)local_130;
                }
              }
              else {
                iVar14 = 0;
                iVar15 = 0;
                lVar43 = 0;
                iVar28 = 0;
                uVar32 = 0;
                palVar17 = local_1d0;
                palVar23 = local_1c8;
                ptr = b;
                ptr_00 = b_00;
                local_1f0 = b_01;
                local_1e8 = b_02;
                local_1a0 = local_1c0;
                local_178 = local_1b8;
              }
              result->score = (int)lVar43;
              result->end_query = uVar32;
              result->end_ref = iVar28;
              ((result->field_4).stats)->matches = iVar15;
              ((result->field_4).stats)->similar = iVar22;
              ((result->field_4).stats)->length = iVar14;
              parasail_free(palVar17);
              parasail_free(palVar23);
              parasail_free(local_1a0);
              parasail_free(local_178);
              parasail_free(b_06);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(local_1e0);
              parasail_free(local_1e8);
              parasail_free(local_1d8);
              parasail_free(local_1f0);
              parasail_free(local_1b0);
              parasail_free(ptr_00);
              parasail_free(local_1f8);
              parasail_free(ptr);
              return result;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

STATIC parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vSaturationCheckMax;
    __m128i vPosLimit;
    int64_t maxp = 0;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile  = (__m128i*)profile->profile64.score;
    vProfileM = (__m128i*)profile->profile64.matches;
    vProfileS = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_INF;
    matches = NEG_INF;
    similar = NEG_INF;
    length = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    vSaturationCheckMax = vZero;
    vPosLimit = _mm_set1_epi64x_rpl(INT64_MAX);
    maxp = INT64_MAX - (int64_t)(matrix->max+1);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    pvHMax    = parasail_memalign___m128i(16, segLen);
    pvHMMax   = parasail_memalign___m128i(16, segLen);
    pvHSMax   = parasail_memalign___m128i(16, segLen);
    pvHLMax   = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;

    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi64x_rpl(-open), segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);
        vHM = _mm_slli_si128(vHM, 8);
        vHS = _mm_slli_si128(vHS, 8);
        vHL = _mm_slli_si128(vHL, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP3(pvHMMax, pvHMLoad, pvHMStore)
            SWAP3(pvHSMax, pvHSLoad, pvHSStore)
            SWAP3(pvHLMax, pvHLLoad, pvHLStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvHMLoad, pvHMStore)
            SWAP(pvHSLoad, pvHSStore)
            SWAP(pvHLLoad, pvHLStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i cond_zero;
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vH_dag = _mm_max_epi64_rpl(vH_dag, vZero);
            vH = _mm_max_epi64_rpl(vH_dag, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            cond_zero = _mm_cmpeq_epi64(vH, vZero);

            case1 = _mm_cmpeq_epi64(vH, vH_dag);
            case2 = _mm_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vHM, _mm_load_si128(vPM + i)), case1);
            vHM = _mm_andnot_si128(cond_zero, vHM);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vHS, _mm_load_si128(vPS + i)), case1);
            vHS = _mm_andnot_si128(cond_zero, vHS);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vHL, vOne), case1);
            vHL = _mm_andnot_si128(cond_zero, vHL);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            vEF_opn = _mm_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi64(vEL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vFL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 8);
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, -open, 0);
            vFM = _mm_slli_si128(vFM, 8);
            vFS = _mm_slli_si128(vFS, 8);
            vFL = _mm_slli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi64(vHp, _mm_load_si128(vP + i));
                vHp = _mm_max_epi64_rpl(vHp, vZero);
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi64(vH, vHp);
                case2 = _mm_cmpeq_epi64(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                /* Update vF value. */
                vEF_opn = _mm_sub_epi64(vH, vGapO);
                vF_ext = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi64_rpl(vF_ext, vEF_opn),
                                _mm_and_si128(
                                    _mm_cmpeq_epi64(vF_ext, vEF_opn),
                                    _mm_cmpgt_epi64_rpl(vF_ext, vZero)))))
                    goto end;
                /*vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi64(vFL, vOne),
                        _mm_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (score == INT64_MAX
            || _mm_movemask_epi8(_mm_cmpeq_epi64(vSaturationCheckMax,vPosLimit))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
        matches = 0;
        similar = 0;
        length = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
            SWAP(pvHMMax, pvHMStore)
            SWAP(pvHSMax, pvHSStore)
            SWAP(pvHLMax, pvHLStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
            SWAP(pvHMMax, pvHMLoad)
            SWAP(pvHSMax, pvHSLoad)
            SWAP(pvHLMax, pvHLLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int64_t *m = (int64_t*)pvHMMax;
            int64_t *s = (int64_t*)pvHSMax;
            int64_t *l = (int64_t*)pvHLMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len;
            for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                        matches = *m;
                        similar = *s;
                        length = *l;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}